

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxConversion.cpp
# Opt level: O2

vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_> *
Jinx::Impl::ParseRow
          (vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_> *__return_storage_ptr__,
          char delimiter,NumericFormat format,char **current,char *end)

{
  char cVar1;
  char *pcVar2;
  char *end_00;
  String str;
  Variant val;
  String local_78;
  Variant local_58;
  
  (__return_storage_ptr__->super__Vector_base<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  end_00 = end;
  do {
    if (*current == end) {
      return __return_storage_ptr__;
    }
    ParseCell_abi_cxx11_
              (&local_78,(Impl *)(ulong)(uint)(int)delimiter,(char)current,(char **)end,end_00);
    ParseValue(&local_58,&local_78,format);
    std::vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>::push_back
              (__return_storage_ptr__,&local_58);
    pcVar2 = *current;
    if (pcVar2 != end) {
      cVar1 = *pcVar2;
      if (cVar1 == delimiter) {
        *current = pcVar2 + 1;
      }
      else if ((cVar1 == '\r') || (cVar1 == '\n')) {
        if ((pcVar2[1] == '\r') || (pcVar2[1] == '\n')) {
          pcVar2 = pcVar2 + 1;
          *current = pcVar2;
        }
        *current = pcVar2 + 1;
        Variant::~Variant(&local_58);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
        ~basic_string(&local_78);
        return __return_storage_ptr__;
      }
    }
    Variant::~Variant(&local_58);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::~basic_string
              (&local_78);
  } while( true );
}

Assistant:

inline_t std::vector<Variant, Jinx::Allocator<Variant>> ParseRow(char delimiter, NumericFormat format, const char ** current, const char * end)
	{
		std::vector<Variant, Jinx::Allocator<Variant>> variants;

		while (*current != end)
		{
			auto str = ParseCell(delimiter, current, end);
			auto val = ParseValue(str, format);
			variants.push_back(val);
			if (*current != end)
			{
				if (**current == delimiter)
				{
					++(*current);
				}
				else if (IsLineEnd(**current))
				{
					if (*current != end)
					{
						const char nc = *((*current) + 1);
						if (IsLineEnd(nc))
							++(*current);
					}
					++(*current);
					break;
				}
			}
		}

		return variants;
	}